

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_literal_string_abi_cxx11_
          (result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc)

{
  undefined1 *puVar1;
  const_iterator rollback;
  value_type *pvVar2;
  ptrdiff_t n;
  internal_error *piVar3;
  syntax_error *this_00;
  pair<toml::string,_toml::detail::region> *ctx;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  allocator_type local_362;
  allocator<char> local_361;
  string local_360;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_340;
  string local_328;
  undefined1 local_308 [8];
  _Alloc_hider local_300;
  undefined1 local_2f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_2e8 [3];
  location inner_loc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  pair<toml::string,_toml::detail::region> local_248;
  result<toml::detail::region,_toml::detail::none_t> close;
  result<toml::detail::region,_toml::detail::none_t> body;
  pair<toml::string,_toml::detail::region> local_138;
  result<toml::detail::region,_toml::detail::none_t> open;
  result<toml::detail::region,_toml::detail::none_t> token;
  
  rollback._M_current = *(char **)(this + 0x40);
  sequence<toml::detail::character<'\''>,_toml::detail::repeat<toml::detail::exclude<toml::detail::either<toml::detail::in_range<'\x00',_'\b'>,_toml::detail::in_range<'\n',_'\x1f'>,_toml::detail::character<'\x7f'>,_toml::detail::character<'\''>_>_>,_toml::detail::unlimited>,_toml::detail::character<'\''>_>
  ::invoke(&token,(location *)this);
  if (token.is_ok_ == true) {
    location::location(&inner_loc,(location *)this);
    location::reset(&inner_loc,rollback);
    character<'\''>::invoke(&open,&inner_loc);
    if (open.is_ok_ == false) {
      piVar3 = (internal_error *)__cxa_allocate_exception(0x78);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_308,"parse_literal_string: invalid token",
                 (allocator<char> *)&local_340);
      source_location::source_location((source_location *)&local_138,&inner_loc);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[12],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_248,(source_location *)&local_138,(char (*) [12])"should be \'");
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_248;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_360,__l_00,(allocator_type *)&local_268);
      local_328._M_dataplus._M_p = (pointer)0x0;
      local_328._M_string_length = 0;
      local_328.field_2._M_allocated_capacity = 0;
      format_underline((string *)&close,(string *)local_308,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_360,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_328,false);
      source_location::source_location((source_location *)&body,&inner_loc);
      internal_error::internal_error(piVar3,(string *)&close,(source_location *)&body);
      __cxa_throw(piVar3,&internal_error::typeinfo,internal_error::~internal_error);
    }
    repeat<toml::detail::exclude<toml::detail::either<toml::detail::in_range<'\x00',_'\b'>,_toml::detail::in_range<'\n',_'\x1f'>,_toml::detail::character<'\x7f'>,_toml::detail::character<'\''>_>_>,_toml::detail::unlimited>
    ::invoke(&body,&inner_loc);
    character<'\''>::invoke(&close,&inner_loc);
    if (close.is_ok_ == false) {
      piVar3 = (internal_error *)__cxa_allocate_exception(0x78);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_328,"parse_literal_string: invalid token",&local_361);
      source_location::source_location((source_location *)&local_138,&inner_loc);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[12],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_248,(source_location *)&local_138,(char (*) [12])"should be \'");
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)&local_248;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_340,__l_01,&local_362);
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      format_underline(&local_360,&local_328,&local_340,&local_268,false);
      source_location::source_location((source_location *)local_308,&inner_loc);
      internal_error::internal_error(piVar3,&local_360,(source_location *)local_308);
      __cxa_throw(piVar3,&internal_error::typeinfo,internal_error::~internal_error);
    }
    pvVar2 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&token);
    region::str_abi_cxx11_((string *)&local_248,pvVar2);
    n = check_utf8_validity((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    if (n != -1) {
      location::reset(&inner_loc,rollback);
      location::advance(&inner_loc,n);
      this_00 = (syntax_error *)__cxa_allocate_exception(0x78);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_328,"parse_literal_string: invalid utf8 sequence found",&local_361
                );
      source_location::source_location((source_location *)&local_138,&inner_loc);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[5],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_248,(source_location *)&local_138,(char (*) [5])0x166744);
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)&local_248;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_340,__l_02,&local_362);
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      format_underline(&local_360,&local_328,&local_340,&local_268,false);
      source_location::source_location((source_location *)local_308,&inner_loc);
      syntax_error::syntax_error(this_00,&local_360,(source_location *)local_308);
      __cxa_throw(this_00,&syntax_error::typeinfo,syntax_error::~syntax_error);
    }
    pvVar2 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&body);
    region::str_abi_cxx11_(&local_360,pvVar2);
    local_300._M_p = local_2f8 + 8;
    local_308[0] = (string)0x1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p == &local_360.field_2) {
      aaStack_2e8[0]._0_8_ = local_360.field_2._8_8_;
    }
    else {
      local_300._M_p = local_360._M_dataplus._M_p;
    }
    local_2f8._0_8_ = local_360._M_string_length;
    local_360._M_string_length = 0;
    local_360.field_2._M_local_buf[0] = '\0';
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    pvVar2 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&token);
    std::pair<toml::string,_toml::detail::region>::pair<toml::string,_true>
              (&local_138,(string *)local_308,pvVar2);
    std::pair<toml::string,_toml::detail::region>::pair(&local_248,&local_138);
    ctx = &local_248;
    result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,(success_type *)&local_248);
    std::pair<toml::string,_toml::detail::region>::~pair(&local_248);
    std::pair<toml::string,_toml::detail::region>::~pair(&local_138);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_360);
    result<toml::detail::region,_toml::detail::none_t>::cleanup(&close,(EVP_PKEY_CTX *)ctx);
    result<toml::detail::region,_toml::detail::none_t>::cleanup(&body,(EVP_PKEY_CTX *)ctx);
    result<toml::detail::region,_toml::detail::none_t>::cleanup(&open,(EVP_PKEY_CTX *)ctx);
    location::~location(&inner_loc);
  }
  else {
    location::reset((location *)this,rollback);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&close,
               "toml::parse_literal_string: the next token is not a valid literal string",
               (allocator<char> *)&local_360);
    source_location::source_location((source_location *)&local_138,(location *)this);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<toml::source_location,_const_char_(&)[5],_true>
              ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_248,(source_location *)&local_138,(char (*) [5])0x166744);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_248;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_308,__l,(allocator_type *)&local_328);
    inner_loc.super_region_base._vptr_region_base = (_func_int **)0x0;
    inner_loc.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    inner_loc.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    format_underline((string *)&body,(string *)&close,
                     (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_308,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&inner_loc,false);
    open._0_8_ = (long)&open.field_1 + 8;
    puVar1 = (undefined1 *)((long)&body.field_1 + 8);
    if ((undefined1 *)body._0_8_ == puVar1) {
      open.field_1.succ.value.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           body.field_1.succ.value.source_.
           super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
    }
    else {
      open.is_ok_ = body.is_ok_;
      open._1_7_ = body._1_7_;
    }
    open.field_1.succ.value.super_region_base._vptr_region_base =
         body.field_1.succ.value.super_region_base._vptr_region_base;
    body.field_1.succ.value.super_region_base._vptr_region_base = (region_base)(_func_int **)0x0;
    body.field_1._8_1_ = 0;
    ctx = (pair<toml::string,_toml::detail::region> *)&open;
    body._0_8_ = puVar1;
    result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,(failure_type *)&open);
    std::__cxx11::string::~string((string *)&open);
    std::__cxx11::string::~string((string *)&body);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&inner_loc);
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_308);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_248);
    source_location::~source_location((source_location *)&local_138);
    std::__cxx11::string::~string((string *)&close);
  }
  result<toml::detail::region,_toml::detail::none_t>::cleanup(&token,(EVP_PKEY_CTX *)ctx);
  return __return_storage_ptr__;
}

Assistant:

inline result<std::pair<toml::string, region>, std::string>
parse_literal_string(location& loc)
{
    const auto first = loc.iter();
    if(const auto token = lex_literal_string::invoke(loc))
    {
        auto inner_loc = loc;
        inner_loc.reset(first);

        const auto open = lex_apostrophe::invoke(inner_loc);
        if(!open)
        {
            throw internal_error(format_underline(
                "parse_literal_string: invalid token",
                {{source_location(inner_loc), "should be '"}}),
                source_location(inner_loc));
        }

        const auto body = repeat<lex_literal_char, unlimited>::invoke(inner_loc);

        const auto close = lex_apostrophe::invoke(inner_loc);
        if(!close)
        {
            throw internal_error(format_underline(
                "parse_literal_string: invalid token",
                {{source_location(inner_loc), "should be '"}}),
                source_location(inner_loc));
        }

        const auto err_loc = check_utf8_validity(token.unwrap().str());
        if(err_loc == -1)
        {
            return ok(std::make_pair(
                      toml::string(body.unwrap().str(), toml::string_t::literal),
                      token.unwrap()));
        }
        else
        {
            inner_loc.reset(first);
            inner_loc.advance(err_loc);
            throw syntax_error(format_underline(
                "parse_literal_string: invalid utf8 sequence found",
                {{source_location(inner_loc), "here"}}),
                source_location(inner_loc));
        }
    }
    else
    {
        loc.reset(first); // rollback
        return err(format_underline("toml::parse_literal_string: "
                   "the next token is not a valid literal string",
                   {{source_location(loc), "here"}}));
    }
}